

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O2

void __thiscall
Js::ConcatStringBuilder::CopyVirtual
          (ConcatStringBuilder *this,char16 *buffer,StringCopyInfoStack *nestedStringTreeCopyInfos,
          byte recursionDepth)

{
  JavascriptString *this_00;
  code *pcVar1;
  StringCopyInfo copyInfo;
  bool bVar2;
  charcount_t cVar3;
  charcount_t cVar4;
  int iVar5;
  undefined4 *puVar6;
  undefined7 in_register_00000009;
  uint uVar7;
  ConcatStringBuilder *current;
  uint uVar8;
  StringCopyInfo local_70;
  undefined8 local_58;
  StringCopyInfoStack *local_50;
  uint local_48;
  uint local_44;
  undefined4 *local_40;
  char16 *local_38;
  
  local_58 = CONCAT71(in_register_00000009,recursionDepth);
  local_50 = nestedStringTreeCopyInfos;
  local_38 = buffer;
  bVar2 = JavascriptString::IsFinalized((JavascriptString *)this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0x1da,"(!this->IsFinalized())","!this->IsFinalized()");
    if (!bVar2) goto LAB_00a0c70d;
    *puVar6 = 0;
  }
  if (local_38 == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0x1db,"(buffer)","buffer");
    if (!bVar2) {
LAB_00a0c70d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  else {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  cVar3 = JavascriptString::GetLength((JavascriptString *)this);
  local_48 = (int)local_58 + 1U & 0xff;
  local_40 = puVar6;
  do {
    if (this == (ConcatStringBuilder *)0x0) {
      return;
    }
    uVar7 = this->m_count;
LAB_00a0c5c6:
    uVar7 = uVar7 - 1;
    if (-1 < (int)uVar7) {
      this_00 = (this->m_slots).ptr[uVar7 & 0x7fffffff].ptr;
      if (this_00 != (JavascriptString *)0x0) {
        cVar4 = JavascriptString::GetLength(this_00);
        uVar8 = cVar3 - cVar4;
        if (cVar3 < cVar4) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                      ,0x1e9,"(remainingCharLengthToCopy >= copyCharLength)",
                                      "remainingCharLengthToCopy >= copyCharLength");
          if (!bVar2) goto LAB_00a0c70d;
          *puVar6 = 0;
        }
        cVar3 = uVar8;
        if ((byte)local_58 == 3) {
          iVar5 = (*(this_00->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6a])(this_00);
          if ((char)iVar5 != '\0') {
            StringCopyInfo::StringCopyInfo(&local_70,this_00,local_38 + uVar8);
            copyInfo.destinationBuffer = local_70.destinationBuffer;
            copyInfo.sourceString = local_70.sourceString;
            copyInfo.isInitialized = local_70.isInitialized;
            copyInfo._17_7_ = local_70._17_7_;
            StringCopyInfoStack::Push(local_50,copyInfo);
            puVar6 = local_40;
            goto LAB_00a0c5c6;
          }
        }
        else if (3 < (byte)local_58) {
          AssertCount = AssertCount + 1;
          local_44 = uVar8;
          Throw::LogAssert();
          puVar6 = local_40;
          *local_40 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                      ,500,"(recursionDepth <= MaxCopyRecursionDepth)",
                                      "recursionDepth <= MaxCopyRecursionDepth");
          if (!bVar2) goto LAB_00a0c70d;
          *puVar6 = 0;
          cVar3 = local_44;
        }
        JavascriptString::Copy(this_00,local_38 + uVar8,local_50,(byte)local_48);
        puVar6 = local_40;
      }
      goto LAB_00a0c5c6;
    }
    this = (this->m_prevChunk).ptr;
  } while( true );
}

Assistant:

void ConcatStringBuilder::CopyVirtual(
        _Out_writes_(m_charLength) char16 *const buffer,
        StringCopyInfoStack &nestedStringTreeCopyInfos,
        const byte recursionDepth)
    {
        Assert(!this->IsFinalized());
        Assert(buffer);

        CharCount remainingCharLengthToCopy = GetLength();
        for(const ConcatStringBuilder *current = this; current; current = current->m_prevChunk)
        {
            for(int i = current->m_count - 1; i >= 0; --i)
            {
                JavascriptString *const s = current->m_slots[i];
                if(!s)
                {
                    continue;
                }

                const CharCount copyCharLength = s->GetLength();
                Assert(remainingCharLengthToCopy >= copyCharLength);
                remainingCharLengthToCopy -= copyCharLength;
                if(recursionDepth == MaxCopyRecursionDepth && s->IsTree())
                {
                    // Don't copy nested string trees yet, as that involves a recursive call, and the recursion can become
                    // excessive. Just collect the nested string trees and the buffer location where they should be copied, and
                    // the caller can deal with those after returning.
                    nestedStringTreeCopyInfos.Push(StringCopyInfo(s, &buffer[remainingCharLengthToCopy]));
                }
                else
                {
                    Assert(recursionDepth <= MaxCopyRecursionDepth);
                    s->Copy(&buffer[remainingCharLengthToCopy], nestedStringTreeCopyInfos, recursionDepth + 1);
                }
            }
        }
    }